

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view gmlc::utilities::string_viewOps::getTailString(string_view input,string_view sep)

{
  string_view sVar1;
  size_type sVar2;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = input._M_str;
  local_18._M_len = input._M_len;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_18,sep._M_str,0xffffffffffffffff,sep._M_len);
  if (sVar2 != 0xffffffffffffffff) {
    lVar3 = sVar2 + sep._M_len;
    local_18._M_str = local_18._M_str + lVar3;
    local_18._M_len = local_18._M_len - lVar3;
  }
  sVar1._M_str = local_18._M_str;
  sVar1._M_len = local_18._M_len;
  return sVar1;
}

Assistant:

std::string_view
    getTailString(std::string_view input, std::string_view sep) noexcept
{
    auto sepLoc = input.rfind(sep);
    if (sepLoc != std::string_view::npos) {
        input.remove_prefix(sepLoc + sep.size());
    }
    return input;
}